

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_channeldata.h
# Opt level: O0

exr_result_t DctCoderChannelData_push_row(DctCoderChannelData *d,uint8_t *r)

{
  void *__dest;
  undefined8 in_RSI;
  long in_RDI;
  uint8_t **n;
  size_t nsize;
  size_t in_stack_ffffffffffffffc8;
  ulong local_30;
  
  if (*(long *)(in_RDI + 400) == *(long *)(in_RDI + 0x188)) {
    if (*(long *)(in_RDI + 400) == 0) {
      local_30 = 0x10;
    }
    else {
      local_30 = (ulong)(*(long *)(in_RDI + 400) * 3) >> 1;
    }
    __dest = internal_exr_alloc(in_stack_ffffffffffffffc8);
    if (__dest == (void *)0x0) {
      return 1;
    }
    if (*(long *)(in_RDI + 0x180) != 0) {
      memcpy(__dest,*(void **)(in_RDI + 0x180),*(long *)(in_RDI + 400) << 3);
      internal_exr_free((void *)0x11e147);
    }
    *(void **)(in_RDI + 0x180) = __dest;
    *(ulong *)(in_RDI + 0x188) = local_30;
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x180) + *(long *)(in_RDI + 400) * 8) = in_RSI;
  *(long *)(in_RDI + 400) = *(long *)(in_RDI + 400) + 1;
  return 0;
}

Assistant:

static exr_result_t
DctCoderChannelData_push_row (DctCoderChannelData* d, uint8_t* r)
{
    if (d->_size == d->_row_alloc_count)
    {
        size_t    nsize = d->_size == 0 ? 16 : ((d->_size * 3) / 2);
        uint8_t** n     = (uint8_t**) internal_exr_alloc (nsize * sizeof (uint8_t*));
        if (n)
        {
            if (d->_rows)
            {
                memcpy (n, d->_rows, sizeof (uint8_t*) * d->_size);
                internal_exr_free (d->_rows);
            }
            d->_rows            = n;
            d->_row_alloc_count = nsize;
        }
        else { return EXR_ERR_OUT_OF_MEMORY; }
    }
    d->_rows[d->_size] = r;
    d->_size++;
    return EXR_ERR_SUCCESS;
}